

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::ProgramFanoutBigProgram(void)

{
  int iVar1;
  mapped_type *pmVar2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> histogram;
  RE2 re1000;
  RE2 re100;
  RE2 re10;
  RE2 re1;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_538;
  LogMessage local_508;
  RE2 local_388;
  RE2 local_2a8;
  RE2 local_1c8;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,"(?:(?:(?:(?:(?:.)?){1})*)+)");
  RE2::RE2(&local_1c8,"(?:(?:(?:(?:(?:.)?){10})*)+)");
  RE2::RE2(&local_2a8,"(?:(?:(?:(?:(?:.)?){100})*)+)");
  RE2::RE2(&local_388,"(?:(?:(?:(?:(?:.)?){1000})*)+)");
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_538._M_impl.super__Rb_tree_header._M_header;
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_538._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_538._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_538._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = RE2::ProgramFanout(&local_e8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 3) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e2,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (3) == (re1.ProgramFanout(&histogram))",
               0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  local_508.severity_ = 3;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,&local_508.severity_);
  if (*pmVar2 != 1) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e3,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (1) == (histogram[3])",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  iVar1 = RE2::ProgramFanout(&local_1c8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 7) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e6,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (7) == (re10.ProgramFanout(&histogram))",
               0x35);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  local_508.severity_ = 7;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,&local_508.severity_);
  if (*pmVar2 != 10) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e7,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (10) == (histogram[7])",0x24);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  iVar1 = RE2::ProgramFanout(&local_2a8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 10) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ea,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (10) == (re100.ProgramFanout(&histogram))",
               0x37);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  local_508.severity_ = 10;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,&local_508.severity_);
  if (*pmVar2 != 100) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1eb,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (100) == (histogram[10])",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  iVar1 = RE2::ProgramFanout(&local_388,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&_Stack_538);
  if (iVar1 != 0xd) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ee,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (13) == (re1000.ProgramFanout(&histogram))"
               ,0x38);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  local_508.severity_ = 0xd;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &_Stack_538,&local_508.severity_);
  if (*pmVar2 != 1000) {
    LogMessage::LogMessage
              (&local_508,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ef,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_508.str_,"Check failed: (1000) == (histogram[13])",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_508);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&_Stack_538);
  RE2::~RE2(&local_388);
  RE2::~RE2(&local_2a8);
  RE2::~RE2(&local_1c8);
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(ProgramFanout, BigProgram) {
  RE2 re1("(?:(?:(?:(?:(?:.)?){1})*)+)");
  RE2 re10("(?:(?:(?:(?:(?:.)?){10})*)+)");
  RE2 re100("(?:(?:(?:(?:(?:.)?){100})*)+)");
  RE2 re1000("(?:(?:(?:(?:(?:.)?){1000})*)+)");

  map<int, int> histogram;

  // 3 is the largest non-empty bucket and has 1 element.
  CHECK_EQ(3, re1.ProgramFanout(&histogram));
  CHECK_EQ(1, histogram[3]);

  // 7 is the largest non-empty bucket and has 10 elements.
  CHECK_EQ(7, re10.ProgramFanout(&histogram));
  CHECK_EQ(10, histogram[7]);

  // 10 is the largest non-empty bucket and has 100 elements.
  CHECK_EQ(10, re100.ProgramFanout(&histogram));
  CHECK_EQ(100, histogram[10]);

  // 13 is the largest non-empty bucket and has 1000 elements.
  CHECK_EQ(13, re1000.ProgramFanout(&histogram));
  CHECK_EQ(1000, histogram[13]);
}